

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O3

err_t cmdPwdRead(cmd_pwd_t *pwd,char *cmdline)

{
  bool_t bVar1;
  err_t eVar2;
  u32 uVar3;
  int iVar4;
  size_t sVar5;
  char *dest;
  ulong uVar6;
  cmd_pwd_t spwd;
  char *pcVar7;
  long lVar8;
  int argc;
  char **argv;
  int local_5c;
  char **local_58;
  ulong local_50;
  undefined8 local_48;
  cmd_pwd_t local_40;
  ulong local_38;
  
  bVar1 = strStartsWith(cmdline,"pass:");
  if (bVar1 != 0) {
    sVar5 = strLen("pass:");
    pcVar7 = cmdline + sVar5;
LAB_00105576:
    sVar5 = strLen(pcVar7);
    dest = (char *)blobCreate(sVar5 + 1);
    *pwd = dest;
    if (dest == (char *)0x0) {
      eVar2 = 0x6e;
    }
    else {
      strCopy(dest,pcVar7);
      eVar2 = 0;
    }
    return eVar2;
  }
  bVar1 = strStartsWith(cmdline,"env:");
  if (bVar1 != 0) {
    sVar5 = strLen("env:");
    pcVar7 = getenv(cmdline + sVar5);
    bVar1 = strIsValid(pcVar7);
    if (pcVar7 == (char *)0x0) {
      return 0x69;
    }
    if (bVar1 == 0) {
      return 0x69;
    }
    goto LAB_00105576;
  }
  bVar1 = strStartsWith(cmdline,"share:");
  if (bVar1 == 0) {
    return 0x25b;
  }
  sVar5 = strLen("share:");
  local_58 = (char **)0x0;
  local_40 = (cmd_pwd_t)0x0;
  eVar2 = cmdArgCreate(&local_5c,&local_58,cmdline + sVar5);
  if (eVar2 != 0) {
    return eVar2;
  }
  local_48 = 0;
  if (local_5c != 0) {
    local_50 = 0;
    local_38 = 0;
    lVar8 = 0;
    do {
      bVar1 = strStartsWith(local_58[lVar8],"-");
      if (bVar1 == 0) break;
      bVar1 = strStartsWith(local_58[lVar8],"-t");
      pcVar7 = local_58[lVar8];
      if (bVar1 == 0) {
        bVar1 = strStartsWith(pcVar7,"-l");
        pcVar7 = local_58[lVar8];
        if (bVar1 == 0) {
          bVar1 = strStartsWith(pcVar7,"-crc");
          if (bVar1 == 0) {
            iVar4 = strCmp(local_58[lVar8],"-pass");
            if (iVar4 != 0) {
LAB_0010593a:
              eVar2 = 0x25b;
              spwd = local_40;
              goto LAB_00105923;
            }
            if (local_40 == (cmd_pwd_t)0x0) {
              local_5c = local_5c + -1;
              eVar2 = cmdPwdRead(&local_40,local_58[lVar8 + 1]);
              if (eVar2 == 0) {
                lVar8 = lVar8 + 2;
                local_5c = local_5c + -1;
                goto LAB_001057fa;
              }
              goto LAB_0010592b;
            }
          }
          else if ((int)local_48 == 0) {
            if (local_50 == 0x10) goto LAB_0010593a;
            lVar8 = lVar8 + 1;
            local_5c = local_5c + -1;
            local_48 = 1;
            goto LAB_001057fa;
          }
        }
        else {
          sVar5 = strLen("-l");
          if (local_50 == 0) {
            pcVar7 = pcVar7 + sVar5;
            bVar1 = decIsValid(pcVar7);
            eVar2 = 0x25b;
            spwd = local_40;
            if (((((bVar1 != 0) && (sVar5 = decCLZ(pcVar7), spwd = local_40, sVar5 == 0)) &&
                 (sVar5 = strLen(pcVar7), spwd = local_40, sVar5 == 3)) &&
                ((uVar3 = decToU32(pcVar7), spwd = local_40, 0xffffff7e < uVar3 - 0x101 &&
                 ((uVar3 & 0x3f) == 0)))) &&
               (local_50 = (ulong)uVar3, uVar3 != 0x80 || (int)local_48 == 0)) {
              local_50 = (ulong)(uVar3 >> 3);
              goto LAB_001057e6;
            }
            goto LAB_00105923;
          }
        }
LAB_00105915:
        eVar2 = 0x25c;
        spwd = local_40;
        goto LAB_00105923;
      }
      sVar5 = strLen("-t");
      if (local_38 != 0) goto LAB_00105915;
      pcVar7 = pcVar7 + sVar5;
      bVar1 = decIsValid(pcVar7);
      eVar2 = 0x25b;
      spwd = local_40;
      if (((bVar1 == 0) || (sVar5 = decCLZ(pcVar7), spwd = local_40, sVar5 != 0)) ||
         ((sVar5 = strLen(pcVar7), spwd = local_40, 2 < sVar5 ||
          (uVar3 = decToU32(pcVar7), spwd = local_40, uVar3 - 0x11 < 0xfffffff1))))
      goto LAB_00105923;
      local_38 = (ulong)uVar3;
LAB_001057e6:
      lVar8 = lVar8 + 1;
      local_5c = local_5c + -1;
LAB_001057fa:
    } while (local_5c != 0);
    spwd = local_40;
    if (local_40 != (cmd_pwd_t)0x0) {
      uVar6 = 2;
      if (local_38 != 0) {
        uVar6 = local_38;
      }
      eVar2 = 0x25b;
      if ((uVar6 <= (ulong)(long)local_5c) &&
         (eVar2 = cmdFileValExist(local_5c,local_58 + lVar8), eVar2 == 0)) {
        eVar2 = cmdPwdReadShare_internal
                          (pwd,(long)local_5c,local_50,(bool_t)local_48,local_58 + lVar8,spwd);
      }
      goto LAB_00105923;
    }
  }
  spwd = (cmd_pwd_t)0x0;
  eVar2 = 0x25b;
LAB_00105923:
  blobClose(spwd);
LAB_0010592b:
  cmdArgClose(local_58);
  return eVar2;
}

Assistant:

err_t cmdPwdRead(cmd_pwd_t* pwd, const char* cmdline)
{
	if (strStartsWith(cmdline, "pass:"))
		return cmdPwdReadPass(pwd, cmdline + strLen("pass:"));
	else if (strStartsWith(cmdline, "env:"))
		return cmdPwdReadEnv(pwd, cmdline + strLen("env:"));
	else if (strStartsWith(cmdline, "share:"))
		return cmdPwdReadShare(pwd, cmdline + strLen("share:"));
	return ERR_CMD_PARAMS;
}